

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::construct_storage(torrent *this)

{
  sha256_hash *this_00;
  uint uVar1;
  element_type *peVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  element_type *peVar7;
  storage_params params;
  storage_holder local_b8;
  uint local_a8;
  string *local_a0;
  file_storage *local_98;
  undefined8 local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_88;
  undefined8 local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_78;
  file_storage *local_70;
  element_type *local_68;
  string *local_60;
  uint local_58;
  vector<download_priority_t,_file_index_t> *local_50;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  uint local_38;
  undefined1 local_34;
  undefined1 local_33;
  
  local_98 = torrent_info::orig_files
                       ((this->super_torrent_hot_members).m_torrent_file.
                        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  peVar6 = (element_type *)
           torrent_info::orig_files
                     ((this->super_torrent_hot_members).m_torrent_file.
                      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  peVar2 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar7 = (element_type *)0x0;
  if (peVar6 != peVar2) {
    peVar7 = peVar2;
  }
  local_a0 = &this->m_save_path;
  uVar1 = *(uint *)&this->field_0x5c0;
  this_00 = &(this->m_info_hash).v2;
  bVar4 = digest32<256L>::is_all_zeros(this_00);
  if (bVar4) {
    local_a8 = (this->m_info_hash).v1.m_number._M_elems[4];
    local_b8.m_disk_io._0_4_ = (this->m_info_hash).v1.m_number._M_elems[0];
    local_b8.m_disk_io._4_4_ = (this->m_info_hash).v1.m_number._M_elems[1];
    local_b8.m_idx.m_val = (this->m_info_hash).v1.m_number._M_elems[2];
    local_b8._12_4_ = (this->m_info_hash).v1.m_number._M_elems[3];
  }
  else {
    local_a8 = (this->m_info_hash).v2.m_number._M_elems[4];
    local_b8.m_disk_io._0_4_ = (this_00->m_number)._M_elems[0];
    local_b8.m_disk_io._4_4_ = (this->m_info_hash).v2.m_number._M_elems[1];
    local_b8.m_idx.m_val = (this->m_info_hash).v2.m_number._M_elems[2];
    local_b8._12_4_ = (this->m_info_hash).v2.m_number._M_elems[3];
  }
  bVar4 = torrent_info::v1((this->super_torrent_hot_members).m_torrent_file.
                           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  local_33 = torrent_info::v2((this->super_torrent_hot_members).m_torrent_file.
                              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
  local_70 = local_98;
  local_60 = local_a0;
  local_48 = (uint)local_b8.m_disk_io;
  uStack_44 = local_b8.m_disk_io._4_4_;
  uStack_40 = local_b8.m_idx.m_val;
  uStack_3c = local_b8._12_4_;
  local_38 = local_a8;
  local_68 = peVar7;
  local_58 = uVar1 >> 4 & 3;
  local_50 = &this->m_file_priority;
  local_34 = bVar4;
  iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [4])();
  ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::torrent,void>
            ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_90,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
  local_80 = local_90;
  p_Stack_78 = p_Stack_88;
  local_90 = 0;
  p_Stack_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar5))
            (&local_b8,(undefined8 *)CONCAT44(extraout_var,iVar5),&local_70);
  storage_holder::operator=(&this->m_storage,&local_b8);
  plVar3 = (long *)CONCAT44(local_b8.m_disk_io._4_4_,(uint)local_b8.m_disk_io);
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))(plVar3,local_b8.m_idx.m_val);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (p_Stack_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_88);
  }
  return;
}

Assistant:

void torrent::construct_storage()
	{
		storage_params params{
			m_torrent_file->orig_files(),
			&m_torrent_file->orig_files() != &m_torrent_file->files()
				? &m_torrent_file->files() : nullptr,
			m_save_path,
			static_cast<storage_mode_t>(m_storage_mode),
			m_file_priority,
			m_info_hash.get_best(),
			m_torrent_file->v1(),
			m_torrent_file->v2()
		};

		// the shared_from_this() will create an intentional
		// cycle of ownership, se the hpp file for description.
		m_storage = m_ses.disk_thread().new_torrent(params, shared_from_this());
	}